

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frac.hpp
# Opt level: O2

Frac<scp::BigInt<unsigned_int,_unsigned_long>_> * __thiscall
scp::Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::operator+=
          (Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *this,
          Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *x)

{
  BigInt<unsigned_int,_unsigned_long> *y;
  BigInt<unsigned_int,_unsigned_long> q;
  BigInt<unsigned_int,_unsigned_long> local_88;
  BigInt<unsigned_int,_unsigned_long> local_68;
  BigInt<unsigned_int,_unsigned_long> local_48;
  
  operator*(&local_88,&this->_p,&x->_q);
  y = &this->_q;
  operator*(&local_48,&x->_p,y);
  BigInt<unsigned_int,_unsigned_long>::operator+=(&local_88,&local_48);
  local_68._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._positive = local_88._positive;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
  operator*(&local_88,y,&x->_q);
  BigInt<unsigned_int,_unsigned_long>::operator=(&this->_p,&local_68);
  BigInt<unsigned_int,_unsigned_long>::operator=(y,&local_88);
  _simplify(this);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68);
  return this;
}

Assistant:

constexpr Frac<TValue>& Frac<TValue>::operator+=(const Frac<TValue>& x)
	{
		const TValue p = _p * x._q + x._p * _q;
		const TValue q = _q * x._q;

		_p = p;
		_q = q;

		_simplify();

		return *this;
	}